

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_token.c
# Opt level: O3

int get_next_token(STRING_TOKEN *token,char **delimiters,size_t n_delims)

{
  void *__ptr;
  size_t sVar1;
  LOGGER_LOG p_Var2;
  int iVar3;
  char *pcVar4;
  char *pcVar5;
  ulong uVar6;
  char *pcVar7;
  char *pcVar8;
  long lVar9;
  char *pcVar10;
  size_t sVar11;
  char *pcVar12;
  ulong uVar13;
  bool bVar14;
  
  if ((token->token_start != (char *)0x0) && (token->delimiter_start == (char *)0x0)) {
    return 0x4a;
  }
  if (n_delims >> 0x3d == 0) {
    __ptr = malloc(n_delims * 8);
    if (__ptr != (void *)0x0) {
      if (n_delims != 0) {
        uVar6 = 8;
        lVar9 = 0;
        do {
          pcVar12 = *(char **)((long)delimiters + (uVar6 - 8));
          if (pcVar12 == (char *)0x0) {
            p_Var2 = xlogging_get_log_function();
            if (p_Var2 != (LOGGER_LOG)0x0) {
              pcVar12 = "Invalid argument (delimiter %lu is NULL)";
              iVar3 = 0x2d;
LAB_00115da8:
              (*p_Var2)(AZ_LOG_ERROR,
                        "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-umqtt-c/deps/c-utility/src/string_token.c"
                        ,"get_delimiters_lengths",iVar3,1,pcVar12);
            }
LAB_00115db3:
            free(__ptr);
            goto LAB_00115dbd;
          }
          if (n_delims * 8 < uVar6) {
            p_Var2 = xlogging_get_log_function();
            if (p_Var2 != (LOGGER_LOG)0x0) {
              pcVar12 = "buffer overflow";
              iVar3 = 0x34;
              goto LAB_00115da8;
            }
            goto LAB_00115db3;
          }
          sVar1 = strlen(pcVar12);
          *(size_t *)((long)__ptr + (uVar6 - 8)) = sVar1;
          lVar9 = lVar9 + -1;
          uVar6 = uVar6 + 8;
        } while (-lVar9 != n_delims);
      }
      pcVar12 = token->source;
      pcVar4 = token->delimiter_start;
      pcVar10 = pcVar12 + token->length;
      pcVar7 = pcVar12;
      if (pcVar4 != (char *)0x0) {
        sVar1 = strlen(token->delimiter);
        pcVar7 = pcVar4 + sVar1;
      }
      pcVar4 = pcVar7;
      if (pcVar7 < pcVar10) {
        pcVar5 = pcVar7 + 2;
        do {
          if (n_delims != 0) {
            sVar11 = 0;
            do {
              if (*pcVar4 == *delimiters[sVar11]) {
                uVar6 = *(ulong *)((long)__ptr + sVar11 * 8);
                uVar13 = 1;
                if ((1 < uVar6) && (pcVar8 = pcVar5, pcVar4 + 1 < pcVar10)) {
                  while (pcVar8[-1] == delimiters[sVar11][uVar13]) {
                    uVar13 = uVar13 + 1;
                    if ((uVar6 <= uVar13) ||
                       (bVar14 = pcVar10 <= pcVar8, pcVar8 = pcVar8 + 1, bVar14)) break;
                  }
                }
                if (uVar13 == uVar6) {
                  token->delimiter_start = pcVar4;
                  token->delimiter = delimiters[sVar11];
                  if (pcVar4 == pcVar12) {
                    pcVar7 = (char *)0x0;
                  }
                  token->token_start = pcVar7;
                  goto LAB_00115d3c;
                }
              }
              sVar11 = sVar11 + 1;
            } while (sVar11 != n_delims);
          }
          pcVar4 = pcVar4 + 1;
          pcVar5 = pcVar5 + 1;
        } while (pcVar4 < pcVar10);
      }
      if (pcVar4 == pcVar10) {
        token->token_start = pcVar7;
        token->delimiter_start = (char *)0x0;
        token->delimiter = (char *)0x0;
      }
LAB_00115d3c:
      free(__ptr);
      return 0;
    }
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 == (LOGGER_LOG)0x0) goto LAB_00115dbd;
    pcVar12 = "Failed to allocate array for delimiters lengths";
    iVar3 = 0x23;
  }
  else {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 == (LOGGER_LOG)0x0) goto LAB_00115dbd;
    pcVar12 = "malloc size overflow";
    iVar3 = 0x1e;
  }
  (*p_Var2)(AZ_LOG_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-umqtt-c/deps/c-utility/src/string_token.c"
            ,"get_delimiters_lengths",iVar3,1,pcVar12);
LAB_00115dbd:
  p_Var2 = xlogging_get_log_function();
  if (p_Var2 != (LOGGER_LOG)0x0) {
    (*p_Var2)(AZ_LOG_ERROR,
              "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-umqtt-c/deps/c-utility/src/string_token.c"
              ,"get_next_token",0x52,1,"Failed to get delimiters lengths");
  }
  return 0x53;
}

Assistant:

static int get_next_token(STRING_TOKEN* token, const char** delimiters, size_t n_delims)
{
    int result;

    if (token->token_start != NULL && token->delimiter_start == NULL)
    {
        // The parser reached the end of the input string.
        result = MU_FAILURE;
    }
    else
    {
        size_t* delimiters_lengths;

        if ((delimiters_lengths = get_delimiters_lengths(delimiters, n_delims)) == NULL)
        {
            LogError("Failed to get delimiters lengths");
            result = MU_FAILURE;
        }
        else
        {
            const char* new_token_start;
            const char* current_pos;
            const char* stop_pos = (char*)token->source + token->length;
            size_t j; // iterator for the delimiters.

            if (token->delimiter_start == NULL)
            {
                // Codes_SRS_STRING_TOKENIZER_09_005: [ The source string shall be split in a token starting from the beginning of source up to occurrence of any one of the demiliters, whichever occurs first in the order provided ]
                new_token_start = (char*)token->source;
            }
            else
            {
                // Codes_SRS_STRING_TOKENIZER_09_010: [ The next token shall be selected starting from the position in source right after the previous delimiter up to occurrence of any one of demiliters, whichever occurs first in the order provided ]
                new_token_start = token->delimiter_start + strlen(token->delimiter);
            }

            current_pos = new_token_start;
            result = 0;

            while (current_pos < stop_pos)
            {
                for (j = 0; j < n_delims; j++)
                {
                    if (*current_pos == *delimiters[j])
                    {
                        size_t k;
                        for (k = 1; k < delimiters_lengths[j] && (current_pos + k) < stop_pos; k++)
                        {
                            if (*(current_pos + k) != *(delimiters[j] + k))
                            {
                                break;
                            }
                        }

                        if (k == delimiters_lengths[j])
                        {
                            token->delimiter_start = current_pos;
                            token->delimiter = delimiters[j];

                            if (token->delimiter_start == token->source)
                            {
                                // Delimiter occurs in the beginning of the source string.
                                token->token_start = NULL;
                            }
                            else
                            {
                                token->token_start = new_token_start;
                            }
                            goto SCAN_COMPLETED;
                        }
                    }
                }

                current_pos++;
            }

            // Codes_SRS_STRING_TOKENIZER_09_006: [ If the source string does not have any of the demiliters, the resulting token shall be the entire source string ]
            // Codes_SRS_STRING_TOKENIZER_09_011: [ If the source string, starting right after the position of the last delimiter found, does not have any of the demiliters, the resulting token shall be the entire remaining of the source string ]
            if (current_pos == stop_pos)
            {
                token->token_start = new_token_start;
                token->delimiter_start = NULL;
                // Codes_SRS_STRING_TOKENIZER_09_019: [ If the current token extends to the end of source, the function shall return NULL ]
                token->delimiter = NULL;
            }

SCAN_COMPLETED:
            free(delimiters_lengths);
        }
    }

    return result;
}